

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XTemplateSerializer.cpp
# Opt level: O0

void xercesc_4_0::XTemplateSerializer::loadObject
               (RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>
                **objToLoad,int param_2,bool toAdopt,XSerializeEngine *serEng)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  MemoryManager *pMVar5;
  RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher> *this;
  DatatypeValidator *this_00;
  XMLCh *src;
  XMLCh *src_00;
  XMLSize_t XVar6;
  XMLSize_t XVar7;
  undefined4 extraout_var;
  MemoryManager *manager;
  XMLStringPool *pXVar8;
  undefined4 extraout_var_00;
  XMLCh *refKey;
  undefined1 local_88 [4];
  uint id;
  ArrayJanitor<char16_t> janName;
  XMLCh *typeKey;
  XMLSize_t localLen;
  XMLSize_t uriLen;
  XMLCh *typeLocal;
  XMLCh *typeUri;
  DatatypeValidator *data;
  XMLSize_t itemIndex;
  XMLSize_t itemNumber;
  XMLSize_t local_28;
  XMLSize_t hashModulus;
  XSerializeEngine *serEng_local;
  bool toAdopt_local;
  RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher> **ppRStack_10;
  int param_1_local;
  RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher> **objToLoad_local;
  
  hashModulus = (XMLSize_t)serEng;
  serEng_local._3_1_ = toAdopt;
  serEng_local._4_4_ = param_2;
  ppRStack_10 = objToLoad;
  bVar2 = XSerializeEngine::needToLoadObject(serEng,objToLoad);
  if (bVar2) {
    XSerializeEngine::readSize((XSerializeEngine *)hashModulus,&local_28);
    if (*ppRStack_10 ==
        (RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher> *)0x0) {
      pMVar5 = XSerializeEngine::getMemoryManager((XSerializeEngine *)hashModulus);
      this = (RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher> *)
             XMemory::operator_new(0x38,pMVar5);
      bVar1 = serEng_local._3_1_;
      pMVar5 = XSerializeEngine::getMemoryManager((XSerializeEngine *)hashModulus);
      RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::RefHashTableOf
                (this,local_28,(bool)(bVar1 & 1),pMVar5);
      *ppRStack_10 = this;
    }
    XSerializeEngine::registerObject((XSerializeEngine *)hashModulus,*ppRStack_10);
    itemIndex = 0;
    XSerializeEngine::readSize((XSerializeEngine *)hashModulus,&itemIndex);
    for (data = (DatatypeValidator *)0x0; data < itemIndex;
        data = (DatatypeValidator *)((long)&(data->super_XSerializable)._vptr_XSerializable + 1)) {
      this_00 = DatatypeValidator::loadDV((XSerializeEngine *)hashModulus);
      src = DatatypeValidator::getTypeUri(this_00);
      src_00 = DatatypeValidator::getTypeLocalName(this_00);
      XVar6 = XMLString::stringLen(src);
      XVar7 = XMLString::stringLen(src_00);
      pMVar5 = XSerializeEngine::getMemoryManager((XSerializeEngine *)hashModulus);
      iVar3 = (*pMVar5->_vptr_MemoryManager[3])(pMVar5,(XVar6 + XVar7) * 2 + 4);
      janName.fMemoryManager = (MemoryManager *)CONCAT44(extraout_var,iVar3);
      XMLString::moveChars((XMLCh *)janName.fMemoryManager,src,XVar6 + 1);
      *(undefined2 *)((long)&(janName.fMemoryManager)->_vptr_MemoryManager + XVar6 * 2) = 0x2c;
      XMLString::moveChars
                ((XMLCh *)((long)&(janName.fMemoryManager)->_vptr_MemoryManager + XVar6 * 2 + 2),
                 src_00,XVar7 + 1);
      pMVar5 = janName.fMemoryManager;
      *(undefined2 *)
       ((long)&(janName.fMemoryManager)->_vptr_MemoryManager + (XVar6 + XVar7) * 2 + 2) = 0;
      manager = XSerializeEngine::getMemoryManager((XSerializeEngine *)hashModulus);
      ArrayJanitor<char16_t>::ArrayJanitor
                ((ArrayJanitor<char16_t> *)local_88,(char16_t *)pMVar5,manager);
      pXVar8 = XSerializeEngine::getStringPool((XSerializeEngine *)hashModulus);
      uVar4 = (*(pXVar8->super_XSerializable)._vptr_XSerializable[9])(pXVar8,janName.fMemoryManager)
      ;
      pXVar8 = XSerializeEngine::getStringPool((XSerializeEngine *)hashModulus);
      iVar3 = (*(pXVar8->super_XSerializable)._vptr_XSerializable[10])(pXVar8,(ulong)uVar4);
      RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::put
                (*ppRStack_10,(void *)CONCAT44(extraout_var_00,iVar3),this_00);
      ArrayJanitor<char16_t>::~ArrayJanitor((ArrayJanitor<char16_t> *)local_88);
    }
  }
  return;
}

Assistant:

void XTemplateSerializer::loadObject(RefHashTableOf<DatatypeValidator>** objToLoad
                                   , int
                                   , bool                                toAdopt
                                   , XSerializeEngine&                   serEng)
{
    if (serEng.needToLoadObject((void**)objToLoad))
    {
        XMLSize_t hashModulus;
        serEng.readSize (hashModulus);

        if (!*objToLoad)
        {
            *objToLoad = new (serEng.getMemoryManager())
                             RefHashTableOf<DatatypeValidator>(
                                                               hashModulus
                                                             , toAdopt
                                                             , serEng.getMemoryManager()
                                                             );
        }

        serEng.registerObject(*objToLoad);

        XMLSize_t itemNumber = 0;
        serEng.readSize (itemNumber);

        for (XMLSize_t itemIndex = 0; itemIndex < itemNumber; itemIndex++)
        {
            DatatypeValidator*  data;
            data = DatatypeValidator::loadDV(serEng);

            /***
             *   restore the key
             ***/
            XMLCh*       typeUri   = (XMLCh*) data->getTypeUri();
            XMLCh*       typeLocal = (XMLCh*) data->getTypeLocalName();
            XMLSize_t    uriLen    = XMLString::stringLen(typeUri);
            XMLSize_t    localLen  = XMLString::stringLen(typeLocal);
            XMLCh*       typeKey   = (XMLCh*) serEng.getMemoryManager()->allocate
                                     (
                                       (uriLen + localLen + 2) * sizeof(XMLCh)
                                     );
            // "typeuri,typeLocal"
            XMLString::moveChars(typeKey, typeUri, uriLen+1);
            typeKey[uriLen] = chComma;
            XMLString::moveChars(&typeKey[uriLen+1], typeLocal, localLen+1);
            typeKey[uriLen + localLen + 1] = chNull;
            ArrayJanitor<XMLCh> janName(typeKey, serEng.getMemoryManager());

            /*
             * get the string from string pool
             *
             *  to do:
             ***/
            unsigned int id = serEng.getStringPool()->getId(typeKey);
            XMLCh* refKey = (XMLCh*) serEng.getStringPool()->getValueForId(id);

            (*objToLoad)->put((void*)refKey, data);
        }
    }
}